

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterialFrom(SemanticParser *this,SP *in)

{
  bool bVar1;
  ostream *this_00;
  element_type *peVar2;
  __shared_ptr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  SP SVar4;
  SP *in_stack_000000b0;
  SemanticParser *in_stack_000000b8;
  SP *in_stack_000000d0;
  SemanticParser *in_stack_000000d8;
  SP *in_stack_00000190;
  SemanticParser *in_stack_00000198;
  string type;
  shared_ptr<pbrt::syntactic::Material> *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffed0;
  SemanticParser *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  SemanticParser *in_stack_fffffffffffffee8;
  SP *in_stack_fffffffffffffef0;
  SemanticParser *in_stack_fffffffffffffef8;
  SP *in_stack_ffffffffffffff10;
  SemanticParser *in_stack_ffffffffffffff18;
  SP *in_stack_ffffffffffffff60;
  SemanticParser *in_stack_ffffffffffffff68;
  SP *in_stack_ffffffffffffff70;
  SemanticParser *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffffa0;
  byte bVar5;
  allocator in_stack_ffffffffffffffa7;
  SemanticParser *in_stack_ffffffffffffffa8;
  SP *in_stack_ffffffffffffffb0;
  SemanticParser *in_stack_ffffffffffffffb8;
  SP *in_stack_ffffffffffffffc0;
  SemanticParser *in_stack_ffffffffffffffc8;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x205a5f);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                            (char *)in_stack_fffffffffffffdd8);
    bVar5 = 0;
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x205a95);
      std::allocator<char>::allocator();
      bVar5 = 1;
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa8,"type",(allocator *)&stack0xffffffffffffffa7);
      syntactic::ParamSet::getParamString
                ((ParamSet *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    }
    else {
      peVar2 = std::
               __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x205b0e);
      std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,(string *)&peVar2->type);
    }
    if ((bVar5 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                            (char *)in_stack_fffffffffffffdd8);
    if (bVar1) {
      std::make_shared<pbrt::Material>();
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                              (char *)in_stack_fffffffffffffdd8);
      if (bVar1) {
        std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                  ((shared_ptr<pbrt::syntactic::Material> *)
                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffdd8);
        createMaterial_plastic
                  (in_stack_ffffffffffffffa8,
                   (SP *)CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(bVar5,in_stack_ffffffffffffffa0)));
        std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::Material> *)0x205c93);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                (char *)in_stack_fffffffffffffdd8);
        if (bVar1) {
          std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                    ((shared_ptr<pbrt::syntactic::Material> *)
                     CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8);
          createMaterial_matte(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                    ((shared_ptr<pbrt::syntactic::Material> *)0x205d3c);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                  (char *)in_stack_fffffffffffffdd8);
          if (bVar1) {
            std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                      ((shared_ptr<pbrt::syntactic::Material> *)
                       CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8);
            createMaterial_metal(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                      ((shared_ptr<pbrt::syntactic::Material> *)0x205de5);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0)
                                    ,(char *)in_stack_fffffffffffffdd8);
            if (bVar1) {
              std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                        ((shared_ptr<pbrt::syntactic::Material> *)
                         CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffdd8);
              createMaterial_fourier(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
              std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                        ((shared_ptr<pbrt::syntactic::Material> *)0x205e8e);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffde7,
                                                  in_stack_fffffffffffffde0),
                                      (char *)in_stack_fffffffffffffdd8);
              if (bVar1) {
                std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                          ((shared_ptr<pbrt::syntactic::Material> *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           in_stack_fffffffffffffdd8);
                createMaterial_mirror(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
                std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                          ((shared_ptr<pbrt::syntactic::Material> *)0x205f2b);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffde7,
                                                    in_stack_fffffffffffffde0),
                                        (char *)in_stack_fffffffffffffdd8);
                if (bVar1) {
                  std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                            ((shared_ptr<pbrt::syntactic::Material> *)
                             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                             in_stack_fffffffffffffdd8);
                  createMaterial_uber(in_stack_000000d8,in_stack_000000d0);
                  std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                            ((shared_ptr<pbrt::syntactic::Material> *)0x205fc8);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffde7,
                                                      in_stack_fffffffffffffde0),
                                          (char *)in_stack_fffffffffffffdd8);
                  if (bVar1) {
                    std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                              ((shared_ptr<pbrt::syntactic::Material> *)
                               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                               in_stack_fffffffffffffdd8);
                    createMaterial_substrate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
                    std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                              ((shared_ptr<pbrt::syntactic::Material> *)0x206065);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffde7,
                                                        in_stack_fffffffffffffde0),
                                            (char *)in_stack_fffffffffffffdd8);
                    if (bVar1) {
                      std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                                ((shared_ptr<pbrt::syntactic::Material> *)
                                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                 in_stack_fffffffffffffdd8);
                      createMaterial_disney(in_stack_00000198,in_stack_00000190);
                      std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                                ((shared_ptr<pbrt::syntactic::Material> *)0x206102);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffde7,
                                                          in_stack_fffffffffffffde0),
                                              (char *)in_stack_fffffffffffffdd8);
                      if (bVar1) {
                        std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                                  ((shared_ptr<pbrt::syntactic::Material> *)
                                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                   in_stack_fffffffffffffdd8);
                        createMaterial_mix(in_stack_000000b8,in_stack_000000b0);
                        std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                                  ((shared_ptr<pbrt::syntactic::Material> *)0x20619f);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffde7,
                                                            in_stack_fffffffffffffde0),
                                                (char *)in_stack_fffffffffffffdd8);
                        if (bVar1) {
                          std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                                    ((shared_ptr<pbrt::syntactic::Material> *)
                                     CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                     in_stack_fffffffffffffdd8);
                          createMaterial_translucent
                                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
                          std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                                    ((shared_ptr<pbrt::syntactic::Material> *)0x20623c);
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffde7,
                                                             in_stack_fffffffffffffde0),
                                                  (char *)in_stack_fffffffffffffdd8);
                          if (bVar1) {
                            std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                                      ((shared_ptr<pbrt::syntactic::Material> *)
                                       CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0)
                                       ,in_stack_fffffffffffffdd8);
                            createMaterial_glass
                                      (in_stack_fffffffffffffed8,
                                       (SP *)in_stack_fffffffffffffed0._M_pi);
                            std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                                      ((shared_ptr<pbrt::syntactic::Material> *)0x2062d9);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffde7,
                                                             in_stack_fffffffffffffde0),
                                                  (char *)in_stack_fffffffffffffdd8);
                            if (bVar1) {
                              std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
                                        ((shared_ptr<pbrt::syntactic::Material> *)
                                         CONCAT17(bVar1,in_stack_fffffffffffffde0),
                                         (shared_ptr<pbrt::syntactic::Material> *)
                                         &stack0xfffffffffffffec8);
                              createMaterial_hair(in_stack_fffffffffffffee8,
                                                  (SP *)in_stack_fffffffffffffee0);
                              std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
                                        ((shared_ptr<pbrt::syntactic::Material> *)0x206374);
                            }
                            else {
                              std::make_shared<pbrt::Material>();
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"warning: empty material!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<pbrt::Material>::shared_ptr((shared_ptr<pbrt::Material> *)0x205a4d);
    _Var3._M_pi = extraout_RDX;
  }
  SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterialFrom(pbrt::syntactic::Material::SP in)
  {
    if (!in) {
      std::cerr << "warning: empty material!" << std::endl;
      return Material::SP();
    }
      
    const std::string type = in->type=="" ? in->getParamString("type") : in->type;

    // ==================================================================
    if (type == "") 
      return std::make_shared<Material>();
        
    // ==================================================================
    if (type == "plastic") 
      return createMaterial_plastic(in);
      
    // ==================================================================
    if (type == "matte")
      return createMaterial_matte(in);
      
    // ==================================================================
    if (type == "metal") 
      return createMaterial_metal(in);
      
    // ==================================================================
    if (type == "fourier") 
      return createMaterial_fourier(in);
      
    // ==================================================================
    if (type == "mirror") 
      return createMaterial_mirror(in);
      
    // ==================================================================
    if (type == "uber") 
      return createMaterial_uber(in);
      
    // ==================================================================
    if (type == "substrate") 
      return createMaterial_substrate(in);
      
    // ==================================================================
    if (type == "disney") 
      return createMaterial_disney(in);

    // ==================================================================
    if (type == "mix")
      return createMaterial_mix(in);

    // ==================================================================
    if (type == "translucent")
      return createMaterial_translucent(in);

    // ==================================================================
    if (type == "glass") 
      return createMaterial_glass(in);

    // ==================================================================
    if (type == "hair") 
      return createMaterial_hair(in);

    // ==================================================================
#ifndef NDEBUG
    std::cout << "Warning: un-recognizd material type '"+type+"'" << std::endl;
#endif
    return std::make_shared<Material>();
  }